

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int archive_filter_count(archive *a)

{
  int iVar1;
  long in_RDI;
  
  iVar1 = (**(code **)(*(long *)(in_RDI + 8) + 0x48))(in_RDI);
  return iVar1;
}

Assistant:

static int
_archive_filter_count(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter *p = a->filter;
	int count = 0;
	while(p) {
		count++;
		p = p->upstream;
	}
	return count;
}